

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

Optional<unsigned_int> __thiscall
Corrade::Utility::Json::parseUnsignedInt(Json *this,JsonToken *token)

{
  bool bVar1;
  State *pSVar2;
  JsonToken *pJVar3;
  size_t sVar4;
  ostream *output;
  Type TVar5;
  Debug *pDVar6;
  JsonToken *in_RDX;
  BasicStringView<const_char> string;
  Flags local_89;
  undefined1 local_88 [8];
  Error err;
  Flags local_49;
  Error local_48;
  JsonToken *local_20;
  JsonToken *token_local;
  Json *this_local;
  
  local_20 = in_RDX;
  token_local = token;
  this_local = this;
  pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->
                     ((Pointer<Corrade::Utility::Json::State> *)token);
  pJVar3 = Containers::Array::operator_cast_to_JsonToken_((Array *)&pSVar2->tokens);
  pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->
                     ((Pointer<Corrade::Utility::Json::State> *)token);
  sVar4 = Containers::
          Array<Corrade::Utility::JsonToken,_void_(*)(Corrade::Utility::JsonToken_*,_unsigned_long)>
          ::size(&pSVar2->tokens);
  if (sVar4 <= (ulong)(((long)in_RDX - (long)pJVar3) / 0x18)) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_49);
    Error::Error(&local_48,output,local_49);
    Debug::operator<<(&local_48.super_Debug,
                      "Utility::Json::parseUnsignedInt(): token not owned by the instance");
    Error::~Error(&local_48);
    abort();
  }
  TVar5 = JsonToken::type(local_20);
  if (TVar5 == Number) {
    bVar1 = parseUnsignedIntInternal((Json *)token,"Utility::Json::parseUnsignedInt():",local_20);
    if (bVar1) {
      Containers::Optional<unsigned_int>::Optional
                ((Optional<unsigned_int> *)this,(uint *)&(local_20->field_2)._childCount);
    }
    else {
      Containers::Optional<unsigned_int>::Optional((Optional<unsigned_int> *)this);
    }
  }
  else {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_89);
    Error::Error((Error *)local_88,local_89);
    pDVar6 = Debug::operator<<((Debug *)local_88,
                               "Utility::Json::parseUnsignedInt(): expected a number, got");
    TVar5 = JsonToken::type(local_20);
    pDVar6 = Utility::operator<<(pDVar6,TVar5);
    Debug::operator<<(pDVar6,"at");
    pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->
                       ((Pointer<Corrade::Utility::Json::State> *)token);
    string = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                       (&pSVar2->string,local_20->_data);
    printFilePosition((Json *)token,(Debug *)local_88,string);
    Containers::Optional<unsigned_int>::Optional((Optional<unsigned_int> *)this);
    Error::~Error((Error *)local_88);
  }
  return (Optional<unsigned_int>)this;
}

Assistant:

Containers::Optional<std::uint32_t> Json::parseUnsignedInt(const JsonToken& token) {
    CORRADE_ASSERT(std::size_t(&token - _state->tokens) < _state->tokens.size(),
        "Utility::Json::parseUnsignedInt(): token not owned by the instance", {});

    if(token.type() != JsonToken::Type::Number) {
        Error err;
        err << "Utility::Json::parseUnsignedInt(): expected a number, got" << token.type() << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }
    if(!parseUnsignedIntInternal("Utility::Json::parseUnsignedInt():", const_cast<JsonToken&>(token)))
        return {};
    return token._parsedUnsignedInt;
}